

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Generators<double> * __thiscall
Catch::Generators::makeGenerators<double,double>
          (Generators<double> *__return_storage_ptr__,Generators *this,double *val,
          double *moreGenerators)

{
  GeneratorWrapper<double> local_20;
  
  local_20.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<double>_*,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<double>_*,_false>._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_20.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<double>_*,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<double>_*,_false>._M_head_impl =
       &PTR__GeneratorUntypedBase_001a4f58;
  *(long *)((long)local_20.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<double>_*,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
                  .super__Head_base<0UL,_Catch::Generators::IGenerator<double>_*,_false>.
                  _M_head_impl + 8) = *(long *)this;
  Generators<double>::Generators<Catch::Generators::GeneratorWrapper<double>,double>
            (__return_storage_ptr__,&local_20,val);
  if (local_20.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<double>_*,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_20.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<double>,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<double>_*,_std::default_delete<Catch::Generators::IGenerator<double>_>_>
                          .super__Head_base<0UL,_Catch::Generators::IGenerator<double>_*,_false>.
                          _M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }